

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapathGen.cpp
# Opt level: O1

void datapathgenerator(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *b,datanode *node)

{
  pointer pcVar1;
  long lVar2;
  int dsize;
  int iVar3;
  int iVar4;
  pointer pbVar5;
  ostream *poVar6;
  int i;
  int i_00;
  int i_01;
  int i_02;
  int i_03;
  int i_04;
  int i_05;
  int i_06;
  int i_07;
  int i_08;
  int i_09;
  int i_10;
  long lVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  float fVar11;
  string str [3];
  string local_418;
  undefined1 *local_3f8 [2];
  undefined1 local_3e8 [16];
  undefined1 *local_3d8 [2];
  undefined1 local_3c8 [16];
  undefined1 *local_3b8 [2];
  undefined1 local_3a8 [16];
  long local_398;
  undefined1 **local_390;
  undefined1 **local_388;
  undefined1 **local_380;
  undefined1 **local_378;
  undefined1 **local_370;
  undefined1 **local_368;
  undefined1 **local_360;
  undefined1 **local_358;
  undefined1 **local_350;
  undefined1 **local_348;
  undefined1 **local_340;
  undefined1 **local_338;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  dsize = nodepointer;
  pbVar5 = (b->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((b->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != pbVar5) {
    local_390 = local_3d8;
    local_370 = local_3f8;
    local_368 = local_3b8;
    local_360 = local_3d8;
    uVar10 = 0;
    iVar9 = 0;
    local_388 = local_390;
    local_380 = local_390;
    local_378 = local_390;
    local_358 = local_360;
    local_350 = local_360;
    local_348 = local_360;
    local_340 = local_360;
    local_338 = local_360;
    do {
      iVar3 = std::__cxx11::string::compare((char *)(pbVar5 + uVar10));
      if (iVar3 == 0) {
        lVar7 = (long)iVar9;
        lVar8 = lVar7 + 2;
        iVar3 = std::__cxx11::string::compare
                          ((char *)((b->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_start + lVar8));
        if (iVar3 == 0) {
          lVar2 = lVar7 + 3;
          iVar3 = std::__cxx11::string::compare
                            ((char *)((b->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + lVar2));
          if (iVar3 == 0) {
            pbVar5 = (b->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
            pcVar1 = pbVar5[lVar7 + 1]._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_418,pcVar1,pcVar1 + pbVar5[lVar7 + 1]._M_string_length);
            pbVar5 = (b->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_3f8[0] = local_3e8;
            pcVar1 = pbVar5[lVar2]._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3f8,pcVar1,pcVar1 + pbVar5[lVar2]._M_string_length);
            local_3d8[0] = local_3c8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"");
            pbVar5 = (b->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            pcVar1 = pbVar5[lVar7 + -1]._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1d0,pcVar1,pcVar1 + pbVar5[lVar7 + -1]._M_string_length);
            pbVar5 = (b->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pcVar1 = pbVar5[lVar8]._M_dataplus._M_p;
            local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_50,pcVar1,pcVar1 + pbVar5[lVar8]._M_string_length);
            calculateDelayComp(node,dsize,i_03,&local_418,&local_1d0,10,&local_50);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_50._M_dataplus._M_p != &local_50.field_2) {
              operator_delete(local_50._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p);
            }
            lVar8 = 0;
            do {
              if (local_3c8 + lVar8 != *(undefined1 **)((long)local_3d8 + lVar8)) {
                operator_delete(*(undefined1 **)((long)local_3d8 + lVar8));
              }
              lVar8 = lVar8 + -0x20;
            } while (lVar8 != -0x60);
          }
          else {
            pbVar5 = (b->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
            pcVar1 = pbVar5[lVar7 + 1]._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_418,pcVar1,pcVar1 + pbVar5[lVar7 + 1]._M_string_length);
            pbVar5 = (b->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_3f8[0] = local_3e8;
            pcVar1 = pbVar5[lVar2]._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)local_3f8,pcVar1,pcVar1 + pbVar5[lVar2]._M_string_length);
            local_3d8[0] = local_3c8;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"");
            pbVar5 = (b->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            pcVar1 = pbVar5[lVar7 + -1]._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1f0,pcVar1,pcVar1 + pbVar5[lVar7 + -1]._M_string_length);
            pbVar5 = (b->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            pcVar1 = pbVar5[lVar8]._M_dataplus._M_p;
            local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_70,pcVar1,pcVar1 + pbVar5[lVar8]._M_string_length);
            calculateDelayComp(node,dsize,i_00,&local_418,&local_1f0,1,&local_70);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p);
            }
            lVar8 = 0;
            do {
              if (local_3c8 + lVar8 != *(undefined1 **)((long)local_3d8 + lVar8)) {
                operator_delete(*(undefined1 **)((long)local_3d8 + lVar8));
              }
              lVar8 = lVar8 + -0x20;
            } while (lVar8 != -0x60);
          }
        }
        else {
          iVar3 = std::__cxx11::string::compare
                            ((char *)((b->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + lVar8));
          if (iVar3 == 0) {
            lVar2 = lVar7 + 3;
            iVar3 = std::__cxx11::string::compare
                              ((char *)((b->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar2));
            if (iVar3 == 0) {
              pbVar5 = (b->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
              pcVar1 = pbVar5[lVar7 + 1]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_418,pcVar1,pcVar1 + pbVar5[lVar7 + 1]._M_string_length);
              pbVar5 = (b->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_3f8[0] = local_3e8;
              pcVar1 = pbVar5[lVar2]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_3f8,pcVar1,pcVar1 + pbVar5[lVar2]._M_string_length);
              local_3d8[0] = local_3c8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"");
              pbVar5 = (b->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
              pcVar1 = pbVar5[lVar7 + -1]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_210,pcVar1,pcVar1 + pbVar5[lVar7 + -1]._M_string_length);
              pbVar5 = (b->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pcVar1 = pbVar5[lVar8]._M_dataplus._M_p;
              local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_90,pcVar1,pcVar1 + pbVar5[lVar8]._M_string_length);
              calculateDelayComp(node,dsize,i_04,&local_418,&local_210,0xb,&local_90);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_90._M_dataplus._M_p != &local_90.field_2) {
                operator_delete(local_90._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_210._M_dataplus._M_p != &local_210.field_2) {
                operator_delete(local_210._M_dataplus._M_p);
              }
              lVar8 = 0;
              do {
                if (local_3c8 + lVar8 != *(undefined1 **)((long)local_3d8 + lVar8)) {
                  operator_delete(*(undefined1 **)((long)local_3d8 + lVar8));
                }
                lVar8 = lVar8 + -0x20;
              } while (lVar8 != -0x60);
            }
            else {
              pbVar5 = (b->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
              pcVar1 = pbVar5[lVar7 + 1]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_418,pcVar1,pcVar1 + pbVar5[lVar7 + 1]._M_string_length);
              pbVar5 = (b->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_3f8[0] = local_3e8;
              pcVar1 = pbVar5[lVar2]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_3f8,pcVar1,pcVar1 + pbVar5[lVar2]._M_string_length);
              local_3d8[0] = local_3c8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"");
              pbVar5 = (b->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
              pcVar1 = pbVar5[lVar7 + -1]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_230,pcVar1,pcVar1 + pbVar5[lVar7 + -1]._M_string_length);
              pbVar5 = (b->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pcVar1 = pbVar5[lVar8]._M_dataplus._M_p;
              local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_b0,pcVar1,pcVar1 + pbVar5[lVar8]._M_string_length);
              calculateDelayComp(node,dsize,i_02,&local_418,&local_230,2,&local_b0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
                operator_delete(local_b0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_230._M_dataplus._M_p != &local_230.field_2) {
                operator_delete(local_230._M_dataplus._M_p);
              }
              lVar8 = 0;
              do {
                if (local_3c8 + lVar8 != *(undefined1 **)((long)local_3d8 + lVar8)) {
                  operator_delete(*(undefined1 **)((long)local_3d8 + lVar8));
                }
                lVar8 = lVar8 + -0x20;
              } while (lVar8 != -0x60);
            }
          }
          else {
            iVar3 = std::__cxx11::string::compare
                              ((char *)((b->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + lVar8));
            if (((iVar3 == 0) ||
                (iVar3 = std::__cxx11::string::compare
                                   ((char *)((b->
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             )._M_impl.super__Vector_impl_data._M_start + lVar8)),
                iVar3 == 0)) ||
               (iVar3 = std::__cxx11::string::compare
                                  ((char *)((b->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + lVar8)),
               iVar3 == 0)) {
              pbVar5 = (b->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
              pcVar1 = pbVar5[lVar7 + 1]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_418,pcVar1,pcVar1 + pbVar5[lVar7 + 1]._M_string_length);
              pbVar5 = (b->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_3f8[0] = local_3e8;
              pcVar1 = pbVar5[lVar7 + 3]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)local_3f8,pcVar1,pcVar1 + pbVar5[lVar7 + 3]._M_string_length);
              local_3d8[0] = local_3c8;
              std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"");
              pbVar5 = (b->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
              pcVar1 = pbVar5[lVar7 + -1]._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_250,pcVar1,pcVar1 + pbVar5[lVar7 + -1]._M_string_length);
              pbVar5 = (b->
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              pcVar1 = pbVar5[lVar8]._M_dataplus._M_p;
              local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_d0,pcVar1,pcVar1 + pbVar5[lVar8]._M_string_length);
              calculateDelayComp(node,dsize,i_01,&local_418,&local_250,4,&local_d0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
                operator_delete(local_d0._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_250._M_dataplus._M_p != &local_250.field_2) {
                operator_delete(local_250._M_dataplus._M_p);
              }
              lVar8 = 0;
              do {
                if (local_3c8 + lVar8 != *(undefined1 **)((long)local_3d8 + lVar8)) {
                  operator_delete(*(undefined1 **)((long)local_3d8 + lVar8));
                }
                lVar8 = lVar8 + -0x20;
              } while (lVar8 != -0x60);
            }
            else {
              iVar3 = std::__cxx11::string::compare
                                ((char *)((b->
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          )._M_impl.super__Vector_impl_data._M_start + lVar8));
              if (iVar3 == 0) {
                pbVar5 = (b->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                pcVar1 = pbVar5[lVar7 + 1]._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_418,pcVar1,pcVar1 + pbVar5[lVar7 + 1]._M_string_length);
                pbVar5 = (b->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                local_3f8[0] = local_3e8;
                pcVar1 = pbVar5[lVar7 + 3]._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_3f8,pcVar1,pcVar1 + pbVar5[lVar7 + 3]._M_string_length);
                local_3d8[0] = local_3c8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"");
                pbVar5 = (b->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
                pcVar1 = pbVar5[lVar7 + -1]._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_270,pcVar1,pcVar1 + pbVar5[lVar7 + -1]._M_string_length)
                ;
                pbVar5 = (b->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                pcVar1 = pbVar5[lVar8]._M_dataplus._M_p;
                local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_f0,pcVar1,pcVar1 + pbVar5[lVar8]._M_string_length);
                calculateDelayComp(node,dsize,i_05,&local_418,&local_270,3,&local_f0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
                  operator_delete(local_f0._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_270._M_dataplus._M_p != &local_270.field_2) {
                  operator_delete(local_270._M_dataplus._M_p);
                }
                lVar8 = 0;
                do {
                  if (local_3c8 + lVar8 != *(undefined1 **)((long)local_3d8 + lVar8)) {
                    operator_delete(*(undefined1 **)((long)local_3d8 + lVar8));
                  }
                  lVar8 = lVar8 + -0x20;
                } while (lVar8 != -0x60);
              }
              else {
                iVar3 = std::__cxx11::string::compare
                                  ((char *)((b->
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start + lVar8));
                if (iVar3 != 0) {
                  iVar3 = iVar9 + 2;
                  iVar4 = std::__cxx11::string::compare
                                    ((char *)((b->
                                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                              )._M_impl.super__Vector_impl_data._M_start + lVar8));
                  if (iVar4 != 0) {
                    local_398 = (lVar7 + 3) * 0x20;
                    iVar4 = std::__cxx11::string::compare
                                      ((char *)((b->
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                )._M_impl.super__Vector_impl_data._M_start +
                                               lVar7 + 3));
                    if (iVar4 != 0) {
                      iVar4 = std::__cxx11::string::compare
                                        ((char *)((b->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + lVar8
                                                 ));
                      if (iVar4 == 0) {
                        pbVar5 = (b->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                        local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                        pcVar1 = pbVar5[lVar7 + 1]._M_dataplus._M_p;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_418,pcVar1,
                                   pcVar1 + pbVar5[lVar7 + 1]._M_string_length);
                        local_3f8[0] = local_3e8;
                        pbVar5 = (b->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                        lVar2 = *(long *)((long)&(pbVar5->_M_dataplus)._M_p + local_398);
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)local_3f8,lVar2,
                                   *(long *)((long)&pbVar5->_M_string_length + local_398) + lVar2);
                        local_3d8[0] = local_3c8;
                        std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"");
                        pbVar5 = (b->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
                        pcVar1 = pbVar5[lVar7 + -1]._M_dataplus._M_p;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_2d0,pcVar1,
                                   pcVar1 + pbVar5[lVar7 + -1]._M_string_length);
                        pbVar5 = (b->
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start;
                        pcVar1 = pbVar5[lVar8]._M_dataplus._M_p;
                        local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
                        std::__cxx11::string::_M_construct<char*>
                                  ((string *)&local_150,pcVar1,
                                   pcVar1 + pbVar5[lVar8]._M_string_length);
                        calculateDelayComp(node,dsize,i_08,&local_418,&local_2d0,7,&local_150);
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_150._M_dataplus._M_p != &local_150.field_2) {
                          operator_delete(local_150._M_dataplus._M_p);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
                          operator_delete(local_2d0._M_dataplus._M_p);
                        }
                        lVar8 = 0;
                        do {
                          if (local_3c8 + lVar8 != *(undefined1 **)((long)local_3d8 + lVar8)) {
                            operator_delete(*(undefined1 **)((long)local_3d8 + lVar8));
                          }
                          lVar8 = lVar8 + -0x20;
                          iVar9 = iVar3;
                        } while (lVar8 != -0x60);
                      }
                      else {
                        iVar4 = std::__cxx11::string::compare
                                          ((char *)((b->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + lVar8
                                                  ));
                        if (iVar4 == 0) {
                          pbVar5 = (b->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start;
                          local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                          pcVar1 = pbVar5[lVar7 + 1]._M_dataplus._M_p;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_418,pcVar1,
                                     pcVar1 + pbVar5[lVar7 + 1]._M_string_length);
                          local_3f8[0] = local_3e8;
                          pbVar5 = (b->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start;
                          lVar2 = *(long *)((long)&(pbVar5->_M_dataplus)._M_p + local_398);
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)local_3f8,lVar2,
                                     *(long *)((long)&pbVar5->_M_string_length + local_398) + lVar2)
                          ;
                          local_3d8[0] = local_3c8;
                          std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"");
                          pbVar5 = (b->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start;
                          local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
                          pcVar1 = pbVar5[lVar7 + -1]._M_dataplus._M_p;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_2f0,pcVar1,
                                     pcVar1 + pbVar5[lVar7 + -1]._M_string_length);
                          pbVar5 = (b->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start;
                          pcVar1 = pbVar5[lVar8]._M_dataplus._M_p;
                          local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
                          std::__cxx11::string::_M_construct<char*>
                                    ((string *)&local_170,pcVar1,
                                     pcVar1 + pbVar5[lVar8]._M_string_length);
                          calculateDelayComp(node,dsize,i_09,&local_418,&local_2f0,6,&local_170);
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_170._M_dataplus._M_p != &local_170.field_2) {
                            operator_delete(local_170._M_dataplus._M_p);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
                            operator_delete(local_2f0._M_dataplus._M_p);
                          }
                          lVar8 = 0;
                          do {
                            if (local_3c8 + lVar8 != *(undefined1 **)((long)local_3d8 + lVar8)) {
                              operator_delete(*(undefined1 **)((long)local_3d8 + lVar8));
                            }
                            lVar8 = lVar8 + -0x20;
                            iVar9 = iVar3;
                          } while (lVar8 != -0x60);
                        }
                        else {
                          iVar4 = std::__cxx11::string::compare
                                            ((char *)((b->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + lVar8
                                                  ));
                          if (iVar4 == 0) {
                            pbVar5 = (b->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start;
                            local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                            pcVar1 = pbVar5[lVar7 + 1]._M_dataplus._M_p;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)&local_418,pcVar1,
                                       pcVar1 + pbVar5[lVar7 + 1]._M_string_length);
                            local_3f8[0] = local_3e8;
                            pbVar5 = (b->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start;
                            lVar2 = *(long *)((long)&(pbVar5->_M_dataplus)._M_p + local_398);
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)local_3f8,lVar2,
                                       *(long *)((long)&pbVar5->_M_string_length + local_398) +
                                       lVar2);
                            local_3d8[0] = local_3c8;
                            std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"");
                            pbVar5 = (b->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start;
                            local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
                            pcVar1 = pbVar5[lVar7 + -1]._M_dataplus._M_p;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)&local_310,pcVar1,
                                       pcVar1 + pbVar5[lVar7 + -1]._M_string_length);
                            pbVar5 = (b->
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     )._M_impl.super__Vector_impl_data._M_start;
                            pcVar1 = pbVar5[lVar8]._M_dataplus._M_p;
                            local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
                            std::__cxx11::string::_M_construct<char*>
                                      ((string *)&local_190,pcVar1,
                                       pcVar1 + pbVar5[lVar8]._M_string_length);
                            calculateDelayComp(node,dsize,i_10,&local_418,&local_310,8,&local_190);
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_190._M_dataplus._M_p != &local_190.field_2) {
                              operator_delete(local_190._M_dataplus._M_p);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_310._M_dataplus._M_p != &local_310.field_2) {
                              operator_delete(local_310._M_dataplus._M_p);
                            }
                            lVar8 = 0;
                            do {
                              if (local_3c8 + lVar8 != *(undefined1 **)((long)local_3d8 + lVar8)) {
                                operator_delete(*(undefined1 **)((long)local_3d8 + lVar8));
                              }
                              lVar8 = lVar8 + -0x20;
                              iVar9 = iVar3;
                            } while (lVar8 != -0x60);
                          }
                          else {
                            iVar4 = std::__cxx11::string::compare
                                              ((char *)((b->
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start + lVar8
                                                  ));
                            if (iVar4 == 0) {
                              pbVar5 = (b->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start;
                              local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                              pcVar1 = pbVar5[lVar7 + 1]._M_dataplus._M_p;
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)&local_418,pcVar1,
                                         pcVar1 + pbVar5[lVar7 + 1]._M_string_length);
                              local_3f8[0] = local_3e8;
                              pbVar5 = (b->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start;
                              lVar2 = *(long *)((long)&(pbVar5->_M_dataplus)._M_p + local_398);
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)local_3f8,lVar2,
                                         *(long *)((long)&pbVar5->_M_string_length + local_398) +
                                         lVar2);
                              local_3d8[0] = local_3c8;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_3d8,"");
                              pbVar5 = (b->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start;
                              local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
                              pcVar1 = pbVar5[lVar7 + -1]._M_dataplus._M_p;
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)&local_330,pcVar1,
                                         pcVar1 + pbVar5[lVar7 + -1]._M_string_length);
                              pbVar5 = (b->
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       )._M_impl.super__Vector_impl_data._M_start;
                              pcVar1 = pbVar5[lVar8]._M_dataplus._M_p;
                              local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
                              std::__cxx11::string::_M_construct<char*>
                                        ((string *)&local_1b0,pcVar1,
                                         pcVar1 + pbVar5[lVar8]._M_string_length);
                              calculateDelayComp(node,dsize,i,&local_418,&local_330,9,&local_1b0);
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
                                operator_delete(local_1b0._M_dataplus._M_p);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_330._M_dataplus._M_p != &local_330.field_2) {
                                operator_delete(local_330._M_dataplus._M_p);
                              }
                              lVar8 = 0;
                              do {
                                if (local_3c8 + lVar8 != *(undefined1 **)((long)local_3d8 + lVar8))
                                {
                                  operator_delete(*(undefined1 **)((long)local_3d8 + lVar8));
                                }
                                lVar8 = lVar8 + -0x20;
                                iVar9 = iVar3;
                              } while (lVar8 != -0x60);
                            }
                          }
                        }
                      }
                      goto LAB_0010b781;
                    }
                  }
                  pbVar5 = (b->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                  pcVar1 = pbVar5[lVar7 + 1]._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_418,pcVar1,pcVar1 + pbVar5[lVar7 + 1]._M_string_length
                            );
                  local_3f8[0] = local_3e8;
                  std::__cxx11::string::_M_construct<char_const*>((string *)local_3f8,"");
                  pbVar5 = (b->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_start;
                  local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
                  pcVar1 = pbVar5[lVar7 + -1]._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_2b0,pcVar1,
                             pcVar1 + pbVar5[lVar7 + -1]._M_string_length);
                  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"=","");
                  calculateDelayComp(node,dsize,i_06,&local_418,&local_2b0,0,&local_130);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_130._M_dataplus._M_p != &local_130.field_2) {
                    operator_delete(local_130._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_2b0._M_dataplus._M_p != &local_2b0.field_2) {
                    operator_delete(local_2b0._M_dataplus._M_p);
                  }
                  lVar8 = 0;
                  do {
                    if (local_3e8 + lVar8 != *(undefined1 **)((long)local_3f8 + lVar8)) {
                      operator_delete(*(undefined1 **)((long)local_3f8 + lVar8));
                    }
                    lVar8 = lVar8 + -0x20;
                    iVar9 = iVar3;
                  } while (lVar8 != -0x40);
                  goto LAB_0010b781;
                }
                pbVar5 = (b->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
                pcVar1 = pbVar5[lVar7 + 1]._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_418,pcVar1,pcVar1 + pbVar5[lVar7 + 1]._M_string_length);
                pbVar5 = (b->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                local_3f8[0] = local_3e8;
                pcVar1 = pbVar5[lVar7 + 3]._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_3f8,pcVar1,pcVar1 + pbVar5[lVar7 + 3]._M_string_length);
                pbVar5 = (b->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                pcVar1 = pbVar5[lVar7 + 5]._M_dataplus._M_p;
                local_3d8[0] = local_3c8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_3d8,pcVar1,pcVar1 + pbVar5[lVar7 + 5]._M_string_length);
                local_3b8[0] = local_3a8;
                std::__cxx11::string::_M_construct<char_const*>((string *)local_3b8,"");
                pbVar5 = (b->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
                pcVar1 = pbVar5[lVar7 + -1]._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_290,pcVar1,pcVar1 + pbVar5[lVar7 + -1]._M_string_length)
                ;
                pbVar5 = (b->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start;
                pcVar1 = pbVar5[lVar8]._M_dataplus._M_p;
                local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_110,pcVar1,pcVar1 + pbVar5[lVar8]._M_string_length);
                calculateDelayComp(node,dsize,i_07,&local_418,&local_290,5,&local_110);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_110._M_dataplus._M_p != &local_110.field_2) {
                  operator_delete(local_110._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_290._M_dataplus._M_p != &local_290.field_2) {
                  operator_delete(local_290._M_dataplus._M_p);
                }
                lVar8 = 0;
                do {
                  if (local_3a8 + lVar8 != *(undefined1 **)((long)local_3b8 + lVar8)) {
                    operator_delete(*(undefined1 **)((long)local_3b8 + lVar8));
                  }
                  lVar8 = lVar8 + -0x20;
                } while (lVar8 != -0x80);
              }
            }
          }
        }
        iVar9 = iVar9 + 4;
      }
LAB_0010b781:
      iVar9 = iVar9 + 1;
      uVar10 = (ulong)iVar9;
      pbVar5 = (b->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar10 < (ulong)((long)(b->
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5)
            );
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  poVar6 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,"Critical Delay : ",0x11);
  fVar11 = maxdelay(node,dsize);
  poVar6 = std::ostream::_M_insert<double>((double)fVar11);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  return;
}

Assistant:

void datapathgenerator(vector<string> & b, struct datanode *node)
{
	int i = 0;
	int dsize = nodepointer;
	while (i < b.size()) {
		if (b[i] == "=")
		{
			if (b[i + 2] == "+")
			{
				if (b[i + 3] == "1")
				{
					string str[] = { b[i + 1],b[i + 3],"\0" };
					calculateDelayComp(node, dsize, i, str, b[i - 1], 10,b[i+2]);
					i = i + 4;
				}
				else
				{
					string str[] = { b[i + 1],b[i + 3],"\0" };
					calculateDelayComp(node, dsize, i, str, b[i - 1], 1,b[i+2]);
					i = i + 4;
				}
			}
			else if (b[i + 2] == "-")
			{
					if (b[i + 3] == "1")
				{
					string str[] = { b[i + 1],b[i + 3],"\0" };
					calculateDelayComp(node, dsize, i, str, b[i - 1], 11,b[i+2]);
					i = i + 4;
				}
				else
				{
					string str[] = { b[i + 1],b[i + 3],"\0" };
					calculateDelayComp(node, dsize, i, str, b[i - 1], 2,b[i+2]);
					i = i + 4;
				}
			}
			else if (b[i + 2] == ">" || (b[i + 2] == "==") || (b[i + 2] == "<"))
			{
				string str[] = { b[i + 1],b[i + 3],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 4,b[i+2]);
				i = i + 4;
			}
			else if (b[i + 2] == "*")
			{
				string str[] = { b[i + 1],b[i + 3],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1],3,b[i+2]);
				i = i + 4;
			}
			else if (b[i + 2] == "?")
			{
				string str[] = { b[i + 1],b[i + 3],b[i + 5],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 5,b[i+2]);
				i = i + 4;
			}

			else if (b[i + 2] == "\0" || b[i+3]=="=")
			{
				string str[] = { b[i + 1],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 0,"=");
				i = i + 2;
			}
			else if (b[i + 2] == "<<")
			{

				string str[] = { b[i + 1],b[i + 3],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 7,b[i+2]);
				i = i + 2;
			}
			else if (b[i + 2] == ">>")
			{

				string str[] = { b[i + 1],b[i + 3],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 6,b[i+2]);
				i = i + 2;
			}
			else if (b[i + 2] == "/")
			{

				string str[] = { b[i + 1],b[i + 3],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 8,b[i+2]);
				i = i + 2;
			}
			else if (b[i + 2] == "%")
			{

				string str[] = { b[i + 1],b[i + 3],"\0" };
				calculateDelayComp(node, dsize, i, str, b[i - 1], 9,b[i+2]);
				i = i + 2;
			}
		}
		i++;
	}
	//printNode(node, dsize);
	cout << endl << "Critical Delay : " << maxdelay(node,dsize)<<endl;
}